

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O2

void __thiscall QAbstractButton::click(QAbstractButton *this)

{
  QAbstractButtonPrivate *this_00;
  bool bVar1;
  long in_FS_OFFSET;
  QWeakPointer<QObject> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((this->super_QWidget).data)->widget_attributes & 1) == 0) {
    this_00 = *(QAbstractButtonPrivate **)&(this->super_QWidget).field_0x8;
    local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    QPointer<QAbstractButton>::QPointer<void>((QPointer<QAbstractButton> *)&local_38,this);
    this_00->field_0x28c = this_00->field_0x28c | 0x10;
    QAbstractButtonPrivate::emitPressed(this_00);
    bVar1 = QPointer::operator_cast_to_bool((QPointer *)&local_38);
    if (bVar1) {
      this_00->field_0x28c = this_00->field_0x28c & 0xef;
      (**(code **)(*(long *)&this->super_QWidget + 0x1b0))(this);
      bVar1 = QPointer::operator_cast_to_bool((QPointer *)&local_38);
      if (bVar1) {
        QAbstractButtonPrivate::emitReleased(this_00);
      }
      bVar1 = QPointer::operator_cast_to_bool((QPointer *)&local_38);
      if (bVar1) {
        QAbstractButtonPrivate::emitClicked(this_00);
      }
    }
    QWeakPointer<QObject>::~QWeakPointer(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractButton::click()
{
    if (!isEnabled())
        return;
    Q_D(QAbstractButton);
    QPointer<QAbstractButton> guard(this);
    d->down = true;
    d->emitPressed();
    if (guard) {
        d->down = false;
        nextCheckState();
        if (guard)
            d->emitReleased();
        if (guard)
            d->emitClicked();
    }
}